

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O0

void plutovg_matrix_rotate(plutovg_matrix_t *matrix,float angle)

{
  undefined1 local_2c [8];
  plutovg_matrix_t m;
  float angle_local;
  plutovg_matrix_t *matrix_local;
  
  m.e = angle;
  unique0x10000046 = matrix;
  plutovg_matrix_init_rotate((plutovg_matrix_t *)local_2c,angle);
  plutovg_matrix_multiply
            (stack0xfffffffffffffff0,(plutovg_matrix_t *)local_2c,stack0xfffffffffffffff0);
  return;
}

Assistant:

void plutovg_matrix_rotate(plutovg_matrix_t* matrix, float angle)
{
    plutovg_matrix_t m;
    plutovg_matrix_init_rotate(&m, angle);
    plutovg_matrix_multiply(matrix, &m, matrix);
}